

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O2

SockData * AGSSock::SockData_CreateFromString(char *str)

{
  string *this;
  allocator<char> local_31;
  string local_30 [32];
  
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_30,str,&local_31);
  std::__cxx11::string::string(this,local_30);
  std::__cxx11::string::~string(local_30);
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,this,&agsSockData);
  return (SockData *)this;
}

Assistant:

SockData *SockData_CreateFromString(const char *str)
{
	SockData *data = new SockData(str);
	AGS_OBJECT(SockData, data);
	return data;
}